

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeDecodingSynapse.cpp
# Opt level: O3

void __thiscall
BSA_SpikeDecodingSynapse::initialize
          (BSA_SpikeDecodingSynapse *this,Population *n_from,Population *n_to)

{
  iterator iVar1;
  int iVar2;
  Clock *pCVar3;
  Logging *pLVar4;
  _Map_pointer ppdVar5;
  ulong uVar6;
  BSA_SpikeDecodingSynapse_param *pBVar7;
  ostream *poVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  double *pdVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  allocator_type local_99;
  double local_98;
  double local_90;
  value_type_conflict1 local_88;
  _Deque_base<double,_std::allocator<double>_> local_80;
  
  iVar2 = (*n_from->_vptr_Population[3])(n_from);
  this->inputSize = iVar2;
  iVar2 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar2;
  if (this->inputSize != iVar2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "Number of input neurons not equal to number of output neurons");
    std::endl<char,std::char_traits<char>>(poVar8);
    puVar9 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar9 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar9,&char_const*::typeinfo,0);
  }
  (this->super_Synapse).from_population = n_from;
  (this->super_Synapse).to_population = n_to;
  pCVar3 = Clock::getInstance();
  this->clock = pCVar3;
  pLVar4 = Logging::getInstance();
  this->logger = pLVar4;
  if (0 < this->inputSize) {
    iVar2 = 0;
    do {
      ppdVar5 = (_Map_pointer)operator_new(0x20);
      *ppdVar5 = (double *)&PTR_setWeight_00114c48;
      ppdVar5[3] = (double *)0x0;
      *(undefined4 *)(ppdVar5 + 1) = 3;
      pCVar3 = Clock::getInstance();
      pdVar14 = (double *)Clock::getCurrentTime(pCVar3);
      ppdVar5[2] = pdVar14;
      local_80._M_impl.super__Deque_impl_data._M_map = ppdVar5;
      std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_80);
      iVar13 = this->inputSize;
      dVar15 = this->param->filter_length;
      uVar6 = (ulong)dVar15;
      local_88 = 0.0;
      std::deque<double,_std::allocator<double>_>::deque
                ((deque<double,_std::allocator<double>_> *)&local_80,
                 (long)(dVar15 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6,&local_88,
                 &local_99);
      std::
      vector<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
      ::_M_fill_assign(&this->input,(long)iVar13,(value_type *)&local_80);
      std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base(&local_80);
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->inputSize);
  }
  pBVar7 = this->param;
  if (pBVar7->window == TRIANGLE) {
    local_90 = pBVar7->filter_length;
    dVar15 = ceil(local_90 * 0.5);
    iVar2 = (int)dVar15;
    uVar12 = (uint)local_90;
    dVar15 = (double)iVar2;
    local_98 = dVar15;
    if (0 < iVar2) {
      dVar16 = 1.0;
      iVar13 = iVar2;
      do {
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((dVar16 / dVar15) * this->param->scale);
        iVar1._M_current =
             (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_90 = dVar16;
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->filter,iVar1,(double *)&local_80);
          dVar15 = local_98;
          dVar16 = local_90;
        }
        else {
          *iVar1._M_current = (double)local_80._M_impl.super__Deque_impl_data._M_map;
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        dVar16 = dVar16 + 1.0;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    if ((uVar12 & 1) == 0) {
      iVar1._M_current =
           (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&this->filter,iVar1,
                   iVar1._M_current + -1);
        dVar15 = local_98;
      }
      else {
        *iVar1._M_current = iVar1._M_current[-1];
        (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
    if (1 < iVar2) {
      uVar12 = iVar2 + 1;
      do {
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)(((double)(int)(uVar12 - 2) / dVar15) * this->param->scale);
        iVar1._M_current =
             (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->filter,iVar1,(double *)&local_80);
          dVar15 = local_98;
        }
        else {
          *iVar1._M_current = (double)local_80._M_impl.super__Deque_impl_data._M_map;
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar12 = uVar12 - 1;
      } while (2 < uVar12);
    }
  }
  else if (pBVar7->window == HAMMING) {
    dVar15 = pBVar7->filter_length;
    dVar16 = 0.0;
    if (0.0 < dVar15) {
      iVar2 = 1;
      do {
        dVar15 = cos((dVar16 * 6.283185307179586) / (dVar15 + -1.0));
        pBVar7 = this->param;
        local_80._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((dVar15 * -0.46 + 0.54) * pBVar7->scale);
        iVar1._M_current =
             (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->filter,iVar1,(double *)&local_80);
          pBVar7 = this->param;
        }
        else {
          *iVar1._M_current = (double)local_80._M_impl.super__Deque_impl_data._M_map;
          (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        dVar16 = (double)iVar2;
        dVar15 = pBVar7->filter_length;
        iVar2 = iVar2 + 1;
      } while (dVar16 < dVar15);
    }
  }
  lVar10 = (long)(this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar11 = lVar10 >> 3;
  auVar17._8_4_ = (int)(lVar10 >> 0x23);
  auVar17._0_8_ = lVar11;
  auVar17._12_4_ = 0x45300000;
  dVar16 = (auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  dVar15 = this->param->filter_length;
  if ((dVar15 != dVar16) || (NAN(dVar15) || NAN(dVar16))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter",0x4d)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  return;
}

Assistant:

void BSA_SpikeDecodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfOutputNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new ValueEvent());
        input.assign(inputSize, deque<double>(param->filter_length, 0));
    }

    if(param->window == HAMMING) {
        for(int i = 0; i < param->filter_length; i++) {
            filter.push_back((0.54 - 0.46 * cos(6.283185307179586*i/(param->filter_length-1))) * param->scale);
        }
    }
    else if(param->window == TRIANGLE) {
        int middle = ceil(param->filter_length/2.0);
        int len = param->filter_length;
        bool isEven = len % 2 == 0;
        for(int i = 1; i <= middle; i++) {
            filter.push_back((i) / (double)middle * param->scale);
        }
        if(isEven) {
            filter.push_back(filter.back());
        }
        for(int i = middle; i > 1; i--) {
            filter.push_back((i-1) / (double)middle * param->scale);
        }
    }
    if(filter.size() != param->filter_length) {
        cout << "BSA_SpikeEncodingSynapse: filter length does not matched the generated filter" << endl;
    }
    // filter = vector<double>{0.05942473828591342,0.07318223830709897,0.11232230333947553,0.17484795255681723,0.25675440297792484,0.3523237031416342,0.454573094246691,0.5558198517560227,0.6483143637949771,0.724886509451,0.7795486730754763,0.8080021690669681,0.8080021690669681,0.7795486730754763,0.724886509451,0.6483143637949771,0.5558198517560227,0.45457309424669107,0.3523237031416343,0.256754402977925,0.17484795255681737,0.11232230333947553,0.07318223830709897,0.05942473828591342};
    // filter = vector<double>{0.0,0.030303030303030304,0.06060606060606061,0.0909090909090909,0.12121212121212122,0.15151515151515152,0.1818181818181818,0.21212121212121213,0.24242424242424243,0.27272727272727276,0.30303030303030304,0.27272727272727276,0.24242424242424243,0.21212121212121213,0.1818181818181818,0.15151515151515152,0.12121212121212122,0.0909090909090909,0.06060606060606061,0.030303030303030304,0.0};
    for(int i = 0; i < param->filter_length; i++) {
        // TODO add
        // filter.push_back(0.5);
    }
}